

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_select.c
# Opt level: O2

void select_poll(ev_loop *loop,ev_tstamp timeout)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  uint revents;
  ulong uVar5;
  uint uVar6;
  size_t __n;
  bool bVar7;
  undefined1 local_48 [8];
  timeval tv;
  
  if (loop->release_cb != (_func_void_ev_loop_ptr *)0x0) {
    tv.tv_usec = (__suseconds_t)timeout;
    (*loop->release_cb)(loop);
    timeout = (ev_tstamp)tv.tv_usec;
  }
  local_48 = (undefined1  [8])(long)timeout;
  tv.tv_sec = (__time_t)((timeout - (double)(long)local_48) * 1000000.0);
  __n = (long)loop->vec_max << 3;
  memcpy(loop->vec_ro,loop->vec_ri,__n);
  memcpy(loop->vec_wo,loop->vec_wi,__n);
  iVar3 = select(loop->vec_max << 6,(fd_set *)loop->vec_ro,(fd_set *)loop->vec_wo,(fd_set *)0x0,
                 (timeval *)local_48);
  if (loop->acquire_cb != (_func_void_ev_loop_ptr *)0x0) {
    (*loop->acquire_cb)(loop);
  }
  if (iVar3 < 0) {
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    if (iVar3 == 9) {
      fd_ebadf(loop);
    }
    else if ((iVar3 == 0xc) && (syserr_cb == (_func_void_char_ptr *)0x0)) {
      fd_enomem(loop);
    }
    else if (iVar3 != 4) {
      ev_syserr("(libev) select");
    }
  }
  else {
    tv.tv_usec = (__suseconds_t)loop->vec_max;
    uVar6 = loop->vec_max * 0x40 - 0x40U | 0x3f;
    while (bVar7 = tv.tv_usec != 0, tv.tv_usec = tv.tv_usec + -1, bVar7) {
      uVar1 = *(ulong *)((long)loop->vec_ro + tv.tv_usec * 8);
      uVar2 = *(ulong *)((long)loop->vec_wo + tv.tv_usec * 8);
      if (uVar1 != 0 || uVar2 != 0) {
        for (uVar5 = 0x3f; uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
          revents = (uint)((uVar2 >> (uVar5 & 0x3f) & 1) != 0) * 2 |
                    (uint)((uVar1 >> (uVar5 & 0x3f) & 1) != 0);
          if (revents != 0) {
            fd_event(loop,uVar6 + (int)uVar5 + -0x3f,revents);
          }
        }
      }
      uVar6 = uVar6 - 0x40;
    }
  }
  return;
}

Assistant:

static void
select_poll (EV_P_ ev_tstamp timeout)
{
  struct timeval tv;
  int res;
  int fd_setsize;

  EV_RELEASE_CB;
  EV_TV_SET (tv, timeout);

#if EV_SELECT_USE_FD_SET
  fd_setsize = sizeof (fd_set);
#else
  fd_setsize = vec_max * NFDBYTES;
#endif

  memcpy (vec_ro, vec_ri, fd_setsize);
  memcpy (vec_wo, vec_wi, fd_setsize);

#ifdef _WIN32
  /* pass in the write set as except set.
   * the idea behind this is to work around a windows bug that causes
   * errors to be reported as an exception and not by setting
   * the writable bit. this is so uncontrollably lame.
   */
  memcpy (vec_eo, vec_wi, fd_setsize);
  res = select (vec_max * NFDBITS, (fd_set *)vec_ro, (fd_set *)vec_wo, (fd_set *)vec_eo, &tv);
#elif EV_SELECT_USE_FD_SET
  fd_setsize = anfdmax < FD_SETSIZE ? anfdmax : FD_SETSIZE;
  res = select (fd_setsize, (fd_set *)vec_ro, (fd_set *)vec_wo, 0, &tv);
#else
  res = select (vec_max * NFDBITS, (fd_set *)vec_ro, (fd_set *)vec_wo, 0, &tv);
#endif
  EV_ACQUIRE_CB;

  if (expect_false (res < 0))
    {
      #if EV_SELECT_IS_WINSOCKET
      errno = WSAGetLastError ();
      #endif
      #ifdef WSABASEERR
      /* on windows, select returns incompatible error codes, fix this */
      if (errno >= WSABASEERR && errno < WSABASEERR + 1000)
        if (errno == WSAENOTSOCK)
          errno = EBADF;
        else
          errno -= WSABASEERR;
      #endif

      #ifdef _WIN32
      /* select on windows erroneously returns EINVAL when no fd sets have been
       * provided (this is documented). what microsoft doesn't tell you that this bug
       * exists even when the fd sets _are_ provided, so we have to check for this bug
       * here and emulate by sleeping manually.
       * we also get EINVAL when the timeout is invalid, but we ignore this case here
       * and assume that EINVAL always means: you have to wait manually.
       */
      if (errno == EINVAL)
        {
          if (timeout)
            {
              unsigned long ms = timeout * 1e3;
              Sleep (ms ? ms : 1);
            }

          return;
        }
      #endif

      if (errno == EBADF)
        fd_ebadf (EV_A);
      else if (errno == ENOMEM && !syserr_cb)
        fd_enomem (EV_A);
      else if (errno != EINTR)
        ev_syserr ("(libev) select");

      return;
    }

#if EV_SELECT_USE_FD_SET

  {
    int fd;

    for (fd = 0; fd < anfdmax; ++fd)
      if (anfds [fd].events)
        {
          int events = 0;
          #if EV_SELECT_IS_WINSOCKET
          SOCKET handle = anfds [fd].handle;
          #else
          int handle = fd;
          #endif

          if (FD_ISSET (handle, (fd_set *)vec_ro)) events |= EV_READ;
          if (FD_ISSET (handle, (fd_set *)vec_wo)) events |= EV_WRITE;
          #ifdef _WIN32
          if (FD_ISSET (handle, (fd_set *)vec_eo)) events |= EV_WRITE;
          #endif

          if (expect_true (events))
            fd_event (EV_A_ fd, events);
        }
  }

#else

  {
    int word, bit;
    for (word = vec_max; word--; )
      {
        fd_mask word_r = ((fd_mask *)vec_ro) [word];
        fd_mask word_w = ((fd_mask *)vec_wo) [word];
        #ifdef _WIN32
        word_w |= ((fd_mask *)vec_eo) [word];
        #endif

        if (word_r || word_w)
          for (bit = NFDBITS; bit--; )
            {
              fd_mask mask = 1UL << bit;
              int events = 0;

              events |= word_r & mask ? EV_READ  : 0;
              events |= word_w & mask ? EV_WRITE : 0;

              if (expect_true (events))
                fd_event (EV_A_ word * NFDBITS + bit, events);
            }
      }
  }

#endif
}